

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>::
~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&this->b);
  QStringBuilder<ProString,_ProString>::~QStringBuilder
            ((QStringBuilder<ProString,_ProString> *)this);
  return;
}

Assistant:

~QStringBuilder() = default;